

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esa.hxx
# Opt level: O2

long esaxx_private::
     suffixtree<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> L,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> R,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> D,long n)

{
  pointer ppVar1;
  long i;
  long lVar2;
  long lVar3;
  pointer ppVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  long lVar6;
  long i_2;
  pair<long,_long> cur;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> S;
  pair<long,_long> local_40;
  
  if (n == 0) {
    lVar2 = 0;
  }
  else {
    L._M_current[*SA._M_current] = SA._M_current[n + -1];
    for (lVar2 = 1; lVar2 < n; lVar2 = lVar2 + 1) {
      L._M_current[SA._M_current[lVar2]] = SA._M_current[lVar2 + -1];
    }
    lVar3 = 0;
    lVar2 = 0;
    if (0 < n) {
      lVar2 = n;
    }
    _Var5._M_current = T._M_current;
    for (lVar6 = 0; lVar6 != lVar2; lVar6 = lVar6 + 1) {
      for (; ((lVar6 + lVar3 < n && (L._M_current[lVar6] + lVar3 < n)) &&
             (_Var5._M_current[lVar3] == T._M_current[L._M_current[lVar6] + lVar3]));
          lVar3 = lVar3 + 1) {
      }
      R._M_current[lVar6] = lVar3;
      lVar3 = lVar3 - (ulong)(0 < lVar3);
      _Var5._M_current = _Var5._M_current + 1;
    }
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      L._M_current[lVar3] = R._M_current[SA._M_current[lVar3]];
    }
    *L._M_current = -1;
    S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cur.first = -1;
    cur.second = -1;
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
    emplace_back<std::pair<long,long>>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&S,&cur);
    lVar3 = 0;
    lVar2 = 0;
    while( true ) {
      cur.second = -1;
      if (lVar3 != n) {
        cur.second = L._M_current[lVar3];
      }
      ppVar1 = S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      cur.first = lVar3;
      while( true ) {
        ppVar4 = ppVar1 + -1;
        lVar6 = ppVar1[-1].second;
        if (lVar6 <= cur.second) break;
        cur.first = ppVar4->first;
        if (cur.first < lVar3 + -1) {
          L._M_current[lVar2] = cur.first;
          R._M_current[lVar2] = lVar3;
          D._M_current[lVar2] = lVar6;
          lVar2 = lVar2 + 1;
        }
        S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar4;
        ppVar1 = ppVar4;
      }
      if (lVar6 < cur.second) {
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::push_back
                  (&S,&cur);
      }
      if (lVar3 == n) break;
      local_40.second = (n + 1) - SA._M_current[lVar3];
      local_40.first = lVar3;
      std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
      emplace_back<std::pair<long,long>>
                ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&S,&local_40);
      lVar3 = lVar3 + 1;
    }
    std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
              (&S.super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
              );
  }
  return lVar2;
}

Assistant:

index_type suffixtree(string_type T, sarray_type SA, sarray_type L, sarray_type R, sarray_type D, index_type n){
  if (n == 0){
    return 0;
  }
  sarray_type Psi = L;
  Psi[SA[0]] = SA[n-1];
  for (index_type i = 1; i < n; ++i){
    Psi[SA[i]] = SA[i-1];
  }

  // Compare at most 2n log n charcters. Practically fastest
  // "Permuted Longest-Common-Prefix Array", Juha Karkkainen, CPM 09
  sarray_type PLCP = R;
  index_type h = 0;
  for (index_type i = 0; i < n; ++i){
    index_type j = Psi[i];
    while (i+h < n && j+h < n && 
	   T[i+h] == T[j+h]){
      ++h;
    }
    PLCP[i] = h;
    if (h > 0) --h;
  }

  sarray_type H = L;
  for (index_type i = 0; i < n; ++i){
    H[i] = PLCP[SA[i]];
  }
  H[0] = -1;

  std::vector<std::pair<index_type, index_type> > S;
  S.push_back(std::make_pair((index_type)-1, (index_type)-1));
  size_t nodeNum = 0;
  for (index_type i = 0; ; ++i){
    std::pair<index_type, index_type> cur (i, (i == n) ? -1 : H[i]);
    std::pair<index_type, index_type> cand(S.back());
    while (cand.second > cur.second){
      if (i - cand.first > 1){
	L[nodeNum] = cand.first;
	R[nodeNum] = i;
	D[nodeNum] = cand.second;
	++nodeNum;
      }
      cur.first = cand.first;
      S.pop_back();
      cand = S.back();
    }
    if (cand.second < cur.second){
      S.push_back(cur);
    }
    if (i == n) break;
    S.push_back(std::make_pair(i, n - SA[i] + 1));
  }
  return nodeNum;
}